

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::DetectMapConflicts(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  long *plVar1;
  ushort *puVar2;
  AlphaNum *in_R8;
  AlphaNum local_a8;
  AlphaNum local_78;
  undefined8 local_48;
  char *local_40;
  
  plVar1 = (long *)(*(undefined8 **)this)[1];
  local_48 = 0x18;
  local_40 = "Expanded map entry type ";
  lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::iterator::operator*((iterator *)**(undefined8 **)this);
  puVar2 = *(ushort **)(*plVar1 + 0x10);
  local_78.piece_._M_len = (size_t)*puVar2;
  local_78.piece_._M_str = (char *)(~local_78.piece_._M_len + (long)puVar2);
  local_a8.piece_._M_len = 0x22;
  local_a8.piece_._M_str = " conflicts with an existing field.";
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_48,&local_78,&local_a8,in_R8);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}